

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.h
# Opt level: O0

BayesianProbitRegressor_Gaussian * __thiscall
CoreML::Specification::BayesianProbitRegressor::mutable_bias(BayesianProbitRegressor *this)

{
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor *this_local;
  
  if (this->bias_ == (BayesianProbitRegressor_Gaussian *)0x0) {
    this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00);
    this->bias_ = this_00;
  }
  return this->bias_;
}

Assistant:

inline ::CoreML::Specification::BayesianProbitRegressor_Gaussian* BayesianProbitRegressor::mutable_bias() {
  
  if (bias_ == NULL) {
    bias_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.BayesianProbitRegressor.bias)
  return bias_;
}